

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O3

string * flatbuffers::anon_unknown_7::ToValueString<unsigned_int>
                   (string *__return_storage_ptr__,BinaryRegion *region,uint8_t *binary)

{
  bool bVar1;
  uint __val;
  char cVar2;
  char cVar3;
  string *psVar4;
  uint uVar5;
  ulong uVar6;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar7;
  byte *pbVar8;
  string __str;
  string local_60;
  uint local_3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_3c = *(uint *)(binary + region->offset);
  uVar6 = (ulong)local_3c;
  if (region->length != 0) {
    pbVar8 = binary + region->length + region->offset;
    uVar7 = 0;
    do {
      pbVar8 = pbVar8 + -1;
      ToHex_abi_cxx11_(&local_60,(flatbuffers *)(ulong)*pbVar8,(uint8_t)uVar6);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      uVar6 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        uVar6 = extraout_RDX_00;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < region->length);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  __val = local_3c;
  cVar3 = '\x01';
  if (9 < local_3c) {
    uVar5 = local_3c;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (uVar5 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_0031ad95;
      }
      if (uVar5 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_0031ad95;
      }
      if (uVar5 < 10000) goto LAB_0031ad95;
      bVar1 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_0031ad95:
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_60,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_60._M_dataplus._M_p,(uint)local_60._M_string_length,__val);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  psVar4 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar4;
}

Assistant:

std::string ToValueString(const BinaryRegion &region, const uint8_t *binary) {
  std::string s;
  s += "0x";
  const T val = ReadScalar<T>(binary + region.offset);
  const uint64_t start_index = region.offset + region.length - 1;
  for (uint64_t i = 0; i < region.length; ++i) {
    s += ToHex(binary[start_index - i]);
  }
  s += " (";
  s += ToString(val);
  s += ")";
  return s;
}